

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgList<float> * __thiscall
cimg_library::CImgList<float>::insert<float>
          (CImgList<float> *this,CImgList<float> *list,uint pos,bool shared)

{
  long lVar1;
  long lVar2;
  CImgList<float> local_40;
  
  if (pos == 0xffffffff) {
    pos = this->_width;
  }
  if (this == list) {
    CImgList(&local_40,list);
    insert<float>(this,&local_40,pos,shared);
    ~CImgList(&local_40);
  }
  else if (0 < (int)list->_width) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      insert(this,(CImg<float> *)((long)&list->_data->_width + lVar1),pos + (int)lVar2,shared);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while (lVar2 < (int)list->_width);
  }
  return this;
}

Assistant:

CImgList<T>& insert(const CImgList<t>& list, const unsigned int pos=~0U, const bool shared=false) {
      const unsigned int npos = pos==~0U?_width:pos;
      if ((void*)this!=(void*)&list) cimglist_for(list,l) insert(list[l],npos+l,shared);
      else insert(CImgList<T>(list),npos,shared);
      return *this;
    }